

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O2

void __thiscall adios2::aggregator::MPIChain::HandshakeLinks(MPIChain *this)

{
  int *count;
  int iVar1;
  allocator local_71;
  Req receiveRequest;
  Req sendRequest;
  int link;
  string local_58;
  Status local_38;
  
  link = -1;
  helper::Comm::Req::Req(&sendRequest);
  count = &(this->super_MPIAggregator).m_Rank;
  iVar1 = (this->super_MPIAggregator).m_Rank;
  if (0 < iVar1) {
    std::__cxx11::string::string
              ((string *)&local_58,"Isend handshake with neighbor, MPIChain aggregator, at Open",
               (allocator *)&receiveRequest);
    helper::Comm::Isend<int>
              ((Comm *)&local_38,(int *)&(this->super_MPIAggregator).m_Comm,(size_t)count,1,
               iVar1 + -1,(string *)0x0);
    helper::Comm::Req::operator=(&sendRequest,(Req *)&local_38);
    helper::Comm::Req::~Req((Req *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    iVar1 = *count;
  }
  if (iVar1 < (this->super_MPIAggregator).m_Size + -1) {
    std::__cxx11::string::string
              ((string *)&local_58,"Irecv handshake with neighbor, MPIChain aggregator, at Open",
               (allocator *)&local_38);
    helper::Comm::Irecv<int>
              ((Comm *)&receiveRequest,(int *)&(this->super_MPIAggregator).m_Comm,(size_t)&link,1,
               iVar1 + 1,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string
              ((string *)&local_58,
               "Irecv Wait handshake with neighbor, MPIChain aggregator, at Open",&local_71);
    helper::Comm::Req::Wait(&local_38,&receiveRequest,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    helper::Comm::Req::~Req(&receiveRequest);
    iVar1 = *count;
  }
  if (0 < iVar1) {
    std::__cxx11::string::string
              ((string *)&local_58,
               "Isend wait handshake with neighbor, MPIChain aggregator, at Open",
               (allocator *)&receiveRequest);
    helper::Comm::Req::Wait(&local_38,&sendRequest,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  helper::Comm::Req::~Req(&sendRequest);
  return;
}

Assistant:

void MPIChain::HandshakeLinks()
{
    int link = -1;

    helper::Comm::Req sendRequest;
    if (m_Rank > 0) // send
    {
        sendRequest = m_Comm.Isend(&m_Rank, 1, m_Rank - 1, 0,
                                   "Isend handshake with neighbor, MPIChain aggregator, at Open");
    }

    if (m_Rank < m_Size - 1) // receive
    {
        helper::Comm::Req receiveRequest = m_Comm.Irecv(
            &link, 1, m_Rank + 1, 0, "Irecv handshake with neighbor, MPIChain aggregator, at Open");

        receiveRequest.Wait("Irecv Wait handshake with neighbor, MPIChain aggregator, at Open");
    }

    if (m_Rank > 0)
    {
        sendRequest.Wait("Isend wait handshake with neighbor, MPIChain aggregator, at Open");
    }
}